

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.h
# Opt level: O3

void __thiscall kws::Parser::SetBuffer(Parser *this,string *buffer)

{
  string *buffer_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  unsigned_long *puVar1;
  iterator iVar2;
  char *pcVar3;
  size_t currentPosition;
  unsigned_long local_48;
  string local_40;
  
  buffer_00 = &this->m_Buffer;
  std::__cxx11::string::_M_assign((string *)buffer_00);
  ConvertBufferToWindowsFileType(this,buffer_00);
  std::__cxx11::string::_M_assign((string *)&this->m_FixedBuffer);
  RemoveComments_abi_cxx11_(&local_40,this,(char *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  puVar1 = (this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar2._M_current =
       (this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (iVar2._M_current != puVar1) {
    (this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
    iVar2._M_current = puVar1;
  }
  this_00 = &this->m_Positions;
  local_48 = 0;
  if (iVar2._M_current ==
      (this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (this_00,iVar2,&local_48);
  }
  else {
    *iVar2._M_current = 0;
    (this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  pcVar3 = (buffer_00->_M_dataplus)._M_p;
  local_48 = 0;
  do {
    if (*pcVar3 == '\n') {
      iVar2._M_current =
           (this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)this_00,iVar2,&local_48);
      }
      else {
        *iVar2._M_current = local_48;
        (this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
    }
    else if (*pcVar3 == '\0') {
      iVar2._M_current =
           (this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)this_00,iVar2,&local_48);
      }
      else {
        *iVar2._M_current = local_48;
        (this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      return;
    }
    local_48 = local_48 + 1;
    pcVar3 = pcVar3 + 1;
  } while( true );
}

Assistant:

void SetBuffer(std::string buffer) 
    {
    m_Buffer = buffer;
    this->ConvertBufferToWindowsFileType(m_Buffer);
    m_FixedBuffer = m_Buffer;
    this->RemoveComments();

    //Fill up the m_positions vector
    m_Positions.clear();
    m_Positions.push_back(0);
    const char* currentCharacter = m_Buffer.c_str();
    size_t currentPosition = 0;
    while( *currentCharacter )
      {
      if( (*currentCharacter) == '\n' )
        m_Positions.push_back(currentPosition);
      currentPosition++;
      currentCharacter++;
      }
    m_Positions.push_back(currentPosition);
    }